

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTCue_GetProperties(FACTCue *pCue,FACTCueInstanceProperties **ppProperties)

{
  FACTVariation *pFVar1;
  FACTSound *pFVar2;
  float fVar3;
  float fVar4;
  ushort uVar5;
  uint32_t uVar6;
  FACTCueInstanceProperties *pFVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  uint8_t *puVar12;
  FACTWaveInstanceProperties waveProps;
  
  if (pCue != (FACTCue *)0x0) {
    FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
    if (pCue->playingSound == (FACTSoundInstance *)0x0) {
      sVar11 = 0x13c;
    }
    else {
      sVar11 = (ulong)pCue->playingSound->sound->trackCount * 0xc + 0x13c;
    }
    pFVar7 = (FACTCueInstanceProperties *)(*pCue->parentBank->parentEngine->pMalloc)(sVar11);
    SDL_memset(pFVar7,0,sVar11);
    FACTSoundBank_GetCueProperties(pCue->parentBank,pCue->index,&pFVar7->cueProperties);
    pFVar1 = pCue->playingVariation;
    if (pFVar1 != (FACTVariation *)0x0) {
      (pFVar7->activeVariationProperties).variationProperties.index = 0;
      fVar3 = pFVar1->minWeight;
      fVar4 = pFVar1->maxWeight;
      (pFVar7->activeVariationProperties).variationProperties.weight = (uint8_t)(int)(fVar4 - fVar3)
      ;
      uVar8 = (uint)(((pCue->field_7).variation)->flags == '\x03');
      (pFVar7->activeVariationProperties).variationProperties.iaVariableMin =
           (float)((int)(uVar8 << 0x1f) >> 0x1f & (uint)fVar3);
      (pFVar7->activeVariationProperties).variationProperties.iaVariableMax =
           (float)((int)(uVar8 << 0x1f) >> 0x1f & (uint)fVar4);
      (pFVar7->activeVariationProperties).variationProperties.linger = pFVar1->linger;
    }
    if (pCue->playingSound != (FACTSoundInstance *)0x0) {
      pFVar2 = pCue->playingSound->sound;
      (pFVar7->activeVariationProperties).soundProperties.category = pFVar2->category;
      (pFVar7->activeVariationProperties).soundProperties.priority = pFVar2->priority;
      (pFVar7->activeVariationProperties).soundProperties.pitch = pFVar2->pitch;
      (pFVar7->activeVariationProperties).soundProperties.volume = pFVar2->volume;
      uVar5 = (ushort)pFVar2->trackCount;
      (pFVar7->activeVariationProperties).soundProperties.numTracks = (ushort)pFVar2->trackCount;
      puVar12 = &(pFVar7->activeVariationProperties).soundProperties.arrTrackProperties[0].loopCount
      ;
      lVar10 = 0;
      for (uVar9 = 0; uVar9 < uVar5; uVar9 = uVar9 + 1) {
        uVar6 = FACTWave_GetProperties
                          (*(FACTWave **)
                            ((long)&(pCue->playingSound->tracks->activeWave).wave + lVar10),
                           &waveProps);
        if (uVar6 == 0) {
          ((FACTTrackProperties *)(puVar12 + -10))->duration =
               (uint32_t)
               (long)(((float)waveProps.properties.durationInSamples /
                      (float)(waveProps.properties.format.dwValue >> 5 & 0x3ffff)) / 1000.0);
          *(uint16_t *)(puVar12 + -6) = 1;
          puVar12[-4] = (byte)waveProps.properties.format.dwValue >> 2 & 7;
          *(uint16_t *)(puVar12 + -2) = 0;
          *puVar12 = *(uint8_t *)
                      (*(long *)((long)&pCue->playingSound->tracks->waveEvt + lVar10) + 9);
        }
        uVar5 = (pFVar7->activeVariationProperties).soundProperties.numTracks;
        puVar12 = puVar12 + 0xc;
        lVar10 = lVar10 + 0x68;
      }
    }
    FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
    *ppProperties = pFVar7;
    return 0;
  }
  return 1;
}

Assistant:

uint32_t FACTCue_GetProperties(
	FACTCue *pCue,
	FACTCueInstanceProperties **ppProperties
) {
	uint32_t i;
	size_t allocSize;
	FACTCueInstanceProperties *cueProps;
	FACTVariationProperties *varProps;
	FACTSoundProperties *sndProps;
	FACTWaveInstanceProperties waveProps;
	if (pCue == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	/* Alloc container (including variable length array space) */
	allocSize = sizeof(FACTCueInstanceProperties);
	if (pCue->playingSound != NULL)
	{
		allocSize += (
			sizeof(FACTTrackProperties) *
			pCue->playingSound->sound->trackCount
		);
	}
	cueProps = (FACTCueInstanceProperties*) pCue->parentBank->parentEngine->pMalloc(
		allocSize
	);
	FAudio_zero(cueProps, allocSize);

	/* Cue Properties */
	FACTSoundBank_GetCueProperties(
		pCue->parentBank,
		pCue->index,
		&cueProps->cueProperties
	);

	/* Variation Properties */
	varProps = &cueProps->activeVariationProperties.variationProperties;
	if (pCue->playingVariation != NULL)
	{
		varProps->index = 0; /* TODO: Index of what...? */
		/* TODO: This is just max - min right? Also why u8 wtf */
		varProps->weight = (uint8_t) (
			pCue->playingVariation->maxWeight -
			pCue->playingVariation->minWeight
		);
		if (pCue->variation->flags == 3)
		{
			varProps->iaVariableMin =
				pCue->playingVariation->minWeight;
			varProps->iaVariableMax =
				pCue->playingVariation->maxWeight;
		}
		else
		{
			varProps->iaVariableMin = 0;
			varProps->iaVariableMax = 0;
		}
		varProps->linger = pCue->playingVariation->linger;
	}

	/* Sound Properties */
	sndProps = &cueProps->activeVariationProperties.soundProperties;
	if (pCue->playingSound != NULL)
	{
		sndProps->category = pCue->playingSound->sound->category;
		sndProps->priority = pCue->playingSound->sound->priority;
		sndProps->pitch = pCue->playingSound->sound->pitch;
		sndProps->volume = pCue->playingSound->sound->volume;
		sndProps->numTracks = pCue->playingSound->sound->trackCount;

		for (i = 0; i < sndProps->numTracks; i += 1)
		{
			if (FACTWave_GetProperties(
				pCue->playingSound->tracks[i].activeWave.wave,
				&waveProps
			) == 0) {
				sndProps->arrTrackProperties[i].duration = (uint32_t) (
					(
						(float) waveProps.properties.durationInSamples /
						(float) waveProps.properties.format.nSamplesPerSec
					) / 1000.0f
				);
				sndProps->arrTrackProperties[i].numVariations = 1; /* ? */
				sndProps->arrTrackProperties[i].numChannels =
					waveProps.properties.format.nChannels;
				sndProps->arrTrackProperties[i].waveVariation = 0; /* ? */
				sndProps->arrTrackProperties[i].loopCount =
					pCue->playingSound->tracks[i].waveEvt->wave.loopCount;
			}
		}
	}

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);

	*ppProperties = cueProps;
	return 0;
}